

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::RenderOverlay(BoardView *this)

{
  long in_RDI;
  bool *in_stack_00000058;
  BoardView *in_stack_00000060;
  BoardView *in_stack_00000930;
  
  ShowInfoPane(in_stack_00000930);
  if ((*(byte *)(in_RDI + 0xd6ac) & 1) != 0) {
    ShowNetList(in_stack_00000060,in_stack_00000058);
  }
  if ((*(byte *)(in_RDI + 0xd6ad) & 1) != 0) {
    ShowPartList(in_stack_00000060,in_stack_00000058);
  }
  return;
}

Assistant:

void BoardView::RenderOverlay() {

	ShowInfoPane();

	// Listing of Net elements
	if (m_showNetList) {
		ShowNetList(&m_showNetList);
	}
	if (m_showPartList) {
		ShowPartList(&m_showPartList);
	}
}